

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ezexample_train.cc
# Opt level: O0

int main(int argc,char **argv)

{
  vw *pvVar1;
  ostream *this;
  void *in_RSI;
  undefined4 in_EDI;
  undefined1 unaff_retaddr;
  io_buf *in_stack_00000008;
  string *in_stack_00000010;
  vw *vw;
  bool in_stack_0000010f;
  vw *in_stack_00000110;
  vw *in_stack_00000280;
  allocator local_39;
  string local_38 [32];
  vw *local_18;
  undefined4 in_stack_fffffffffffffff8;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_38,"--hash all -q st --noconstant -f train.w --quiet --csoaa_ldf m",&local_39);
  pvVar1 = VW::initialize(in_stack_00000010,in_stack_00000008,(bool)unaff_retaddr,
                          (trace_message_t)CONCAT44(in_EDI,in_stack_fffffffffffffff8),in_RSI);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  local_18 = pvVar1;
  run(in_stack_00000280);
  this = std::operator<<((ostream *)&std::cerr,"ezexample_train finish");
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  VW::finish(in_stack_00000110,in_stack_0000010f);
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{ // INITIALIZE WITH WHATEVER YOU WOULD PUT ON THE VW COMMAND LINE -- THIS WILL STORE A MODEL TO train.ezw
  vw* vw = VW::initialize("--hash all -q st --noconstant -f train.w --quiet --csoaa_ldf m");

  run(vw);

  // AND FINISH UP
  cerr << "ezexample_train finish"<<endl;
  VW::finish(*vw);
}